

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O2

bool __thiscall
cmStringCommand::RegexMatchAll
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *delimiter;
  pointer pbVar1;
  cmCommand *this_00;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  char *pcVar5;
  _Alloc_hider string;
  string output;
  string e_1;
  string input;
  RegularExpression re;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  pointer local_178;
  cmCommand *local_170;
  undefined1 local_168 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_148;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  RegularExpression local_100;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  cmMakefile::ClearMatches((this->super_cmCommand).Makefile);
  local_100.program = (char *)0x0;
  bVar4 = cmsys::RegularExpression::compile(&local_100,pbVar1[2]._M_dataplus._M_p);
  if (bVar4) {
    local_168._8_8_ =
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    local_168._0_8_ =
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start + 4;
    delimiter = &local_198.field_2;
    local_198._M_string_length = 0;
    local_198.field_2._M_local_buf[0] = '\0';
    local_198._M_dataplus._M_p = (pointer)delimiter;
    local_178 = pbVar1;
    local_148 = pbVar1 + 2;
    cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (&local_140,
               (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)local_168,delimiter->_M_local_buf);
    local_178 = local_178 + 3;
    std::__cxx11::string::~string((string *)&local_198);
    local_198._M_string_length = 0;
    local_198.field_2._M_local_buf[0] = '\0';
    string._M_p = local_140._M_dataplus._M_p;
    local_198._M_dataplus._M_p = (pointer)delimiter;
    local_170 = &this->super_cmCommand;
    while( true ) {
      bVar4 = cmsys::RegularExpression::find(&local_100,string._M_p);
      if (!bVar4) break;
      cmMakefile::ClearMatches((this->super_cmCommand).Makefile);
      cmMakefile::StoreMatches((this->super_cmCommand).Makefile,&local_100);
      pcVar3 = local_100.searchstring;
      pcVar2 = local_100.endp[0];
      pcVar5 = local_100.startp[0];
      if (local_100.endp[0] == local_100.startp[0]) {
        std::operator+(&local_120,"sub-command REGEX, mode MATCHALL regex \"",local_148);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_168,&local_120,"\" matched an empty string.");
        this_00 = local_170;
        std::__cxx11::string::~string((string *)&local_120);
        cmCommand::SetError(this_00,(string *)local_168);
        std::__cxx11::string::~string((string *)local_168);
        goto LAB_00331c18;
      }
      if (local_198._M_string_length != 0) {
        std::__cxx11::string::append((char *)&local_198);
      }
      pcVar5 = string._M_p + ((long)pcVar5 - (long)pcVar3);
      local_168._0_8_ = local_168 + 0x10;
      string._M_p = string._M_p + ((long)pcVar2 - (long)pcVar3);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_168,pcVar5,string._M_p);
      std::__cxx11::string::append((string *)&local_198);
      this = (cmStringCommand *)local_170;
      std::__cxx11::string::~string((string *)local_168);
    }
    cmMakefile::AddDefinition((this->super_cmCommand).Makefile,local_178,local_198._M_dataplus._M_p)
    ;
LAB_00331c18:
    bVar4 = !bVar4;
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_140);
  }
  else {
    std::operator+(&local_198,"sub-command REGEX, mode MATCHALL failed to compile regex \"",
                   pbVar1 + 2);
    std::operator+(&local_140,&local_198,"\".");
    std::__cxx11::string::~string((string *)&local_198);
    cmCommand::SetError(&this->super_cmCommand,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    bVar4 = false;
  }
  cmsys::RegularExpression::~RegularExpression(&local_100);
  return bVar4;
}

Assistant:

bool cmStringCommand::RegexMatchAll(std::vector<std::string> const& args)
{
  //"STRING(REGEX MATCHALL <regular_expression> <output variable> <input>
  // [<input>...])\n";
  std::string const& regex = args[2];
  std::string const& outvar = args[3];

  this->Makefile->ClearMatches();
  // Compile the regular expression.
  cmsys::RegularExpression re;
  if (!re.compile(regex.c_str())) {
    std::string e =
      "sub-command REGEX, mode MATCHALL failed to compile regex \"" + regex +
      "\".";
    this->SetError(e);
    return false;
  }

  // Concatenate all the last arguments together.
  std::string input = cmJoin(cmMakeRange(args).advance(4), std::string());

  // Scan through the input for all matches.
  std::string output;
  const char* p = input.c_str();
  while (re.find(p)) {
    this->Makefile->ClearMatches();
    this->Makefile->StoreMatches(re);
    std::string::size_type l = re.start();
    std::string::size_type r = re.end();
    if (r - l == 0) {
      std::string e = "sub-command REGEX, mode MATCHALL regex \"" + regex +
        "\" matched an empty string.";
      this->SetError(e);
      return false;
    }
    if (!output.empty()) {
      output += ";";
    }
    output += std::string(p + l, r - l);
    p += r;
  }

  // Store the output in the provided variable.
  this->Makefile->AddDefinition(outvar, output.c_str());
  return true;
}